

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteDescriptorCacheItems
          (WalletBatch *this,uint256 *desc_id,DescriptorCache *cache)

{
  bool bVar1;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  pair<const_unsigned_int,_CExtPubKey> *lh_xpub_pair;
  ExtPubKeyMap *__range1_2;
  value_type *derived_xpub_pair;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *__range2;
  pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>
  *derived_xpub_map_pair;
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
  *__range1_1;
  pair<const_unsigned_int,_CExtPubKey> *parent_xpub_pair;
  ExtPubKeyMap *__range1;
  iterator __end1_2;
  iterator __begin1_2;
  const_iterator __end2;
  const_iterator __begin2;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *in_stack_fffffffffffffe78;
  DescriptorCache *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  reference in_stack_fffffffffffffea8;
  CExtPubKey *in_stack_fffffffffffffeb0;
  CExtPubKey *in_stack_fffffffffffffeb8;
  WalletBatch *this_00;
  uint32_t in_stack_fffffffffffffee4;
  int iVar2;
  uint32_t key_exp_index;
  byte local_f1;
  WalletBatch local_88 [3];
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorCache::GetCachedParentExtPubKeys(in_stack_fffffffffffffe80);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                *)in_stack_fffffffffffffe80);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
              *)in_stack_fffffffffffffe80);
  while( true ) {
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                       CONCAT17(in_stack_fffffffffffffe8f,
                                CONCAT16(in_stack_fffffffffffffe8e,
                                         CONCAT15(in_stack_fffffffffffffe8d,
                                                  CONCAT14(in_stack_fffffffffffffe8c,
                                                           in_stack_fffffffffffffe88)))),
                       (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                       in_stack_fffffffffffffe80);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
              in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe8f =
         WriteDescriptorParentCache
                   ((WalletBatch *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (uint256 *)in_stack_fffffffffffffea8,in_stack_fffffffffffffee4);
    if (!(bool)in_stack_fffffffffffffe8f) {
      local_f1 = 0;
      iVar2 = 1;
      goto LAB_002da1a5;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
               in_stack_fffffffffffffe78);
  }
  iVar2 = 2;
LAB_002da1a5:
  std::
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  ::~unordered_map(in_stack_fffffffffffffe78);
  if (iVar2 != 1) {
    DescriptorCache::GetCachedDerivedExtPubKeys(in_stack_fffffffffffffe80);
    this_00 = local_88;
    std::
    unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
    ::begin(&in_stack_fffffffffffffe80->m_derived_xpubs);
    std::
    unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
    ::end(&in_stack_fffffffffffffe80->m_derived_xpubs);
    while( true ) {
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                          *)CONCAT17(in_stack_fffffffffffffe8f,
                                     CONCAT16(in_stack_fffffffffffffe8e,
                                              CONCAT15(in_stack_fffffffffffffe8d,
                                                       CONCAT14(in_stack_fffffffffffffe8c,
                                                                in_stack_fffffffffffffe88)))),
                         (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                          *)in_stack_fffffffffffffe80);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffeb8 =
           (CExtPubKey *)
           std::__detail::
           _Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
           ::operator*((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                        *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffeb0 = (CExtPubKey *)(in_stack_fffffffffffffeb8->vchFingerprint + 3);
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
               *)in_stack_fffffffffffffe80);
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
             *)in_stack_fffffffffffffe80);
      while( true ) {
        bVar1 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                           CONCAT17(in_stack_fffffffffffffe8f,
                                    CONCAT16(in_stack_fffffffffffffe8e,
                                             CONCAT15(in_stack_fffffffffffffe8d,
                                                      CONCAT14(in_stack_fffffffffffffe8c,
                                                               in_stack_fffffffffffffe88)))),
                           (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                           in_stack_fffffffffffffe80);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        in_stack_fffffffffffffea8 =
             std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                        *)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe8e =
             WriteDescriptorDerivedCache
                       (this_00,in_stack_fffffffffffffeb8,(uint256 *)in_stack_fffffffffffffeb0,
                        (uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
        if (!(bool)in_stack_fffffffffffffe8e) {
          local_f1 = 0;
          key_exp_index = 1;
          goto LAB_002da338;
        }
        std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
        ::operator++((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                      *)in_stack_fffffffffffffe78);
      }
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                    *)in_stack_fffffffffffffe78);
    }
    key_exp_index = 4;
LAB_002da338:
    std::
    unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                      *)in_stack_fffffffffffffe78);
    if (key_exp_index != 1) {
      DescriptorCache::GetCachedLastHardenedExtPubKeys(in_stack_fffffffffffffe80);
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
               *)in_stack_fffffffffffffe80);
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
             *)in_stack_fffffffffffffe80);
      while( true ) {
        bVar1 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                           CONCAT17(in_stack_fffffffffffffe8f,
                                    CONCAT16(in_stack_fffffffffffffe8e,
                                             CONCAT15(in_stack_fffffffffffffe8d,
                                                      CONCAT14(in_stack_fffffffffffffe8c,
                                                               in_stack_fffffffffffffe88)))),
                           (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                           in_stack_fffffffffffffe80);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
        operator*((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
                  in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe8d =
             WriteDescriptorLastHardenedCache
                       ((WalletBatch *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                        (uint256 *)in_stack_fffffffffffffea8,key_exp_index);
        if (!(bool)in_stack_fffffffffffffe8d) {
          local_f1 = 0;
          iVar2 = 1;
          goto LAB_002da448;
        }
        std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
                   in_stack_fffffffffffffe78);
      }
      iVar2 = 8;
LAB_002da448:
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::~unordered_map(in_stack_fffffffffffffe78);
      if (iVar2 != 1) {
        local_f1 = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_f1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorCacheItems(const uint256& desc_id, const DescriptorCache& cache)
{
    for (const auto& parent_xpub_pair : cache.GetCachedParentExtPubKeys()) {
        if (!WriteDescriptorParentCache(parent_xpub_pair.second, desc_id, parent_xpub_pair.first)) {
            return false;
        }
    }
    for (const auto& derived_xpub_map_pair : cache.GetCachedDerivedExtPubKeys()) {
        for (const auto& derived_xpub_pair : derived_xpub_map_pair.second) {
            if (!WriteDescriptorDerivedCache(derived_xpub_pair.second, desc_id, derived_xpub_map_pair.first, derived_xpub_pair.first)) {
                return false;
            }
        }
    }
    for (const auto& lh_xpub_pair : cache.GetCachedLastHardenedExtPubKeys()) {
        if (!WriteDescriptorLastHardenedCache(lh_xpub_pair.second, desc_id, lh_xpub_pair.first)) {
            return false;
        }
    }
    return true;
}